

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::FileOptions::_InternalParse(FileOptions *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  Arena *metadata;
  string *psVar2;
  uint64 uVar3;
  FileOptions *pFVar4;
  ParseContext *in_RDX;
  FileOptions *in_RSI;
  FileOptions *in_RDI;
  uint64 val;
  uint32 tag;
  Arena *arena;
  HasBits has_bits;
  char **in_stack_ffffffffffffff78;
  FileOptions *in_stack_ffffffffffffff80;
  ParseContext *in_stack_ffffffffffffff88;
  FileOptions *in_stack_ffffffffffffff90;
  ParseContext *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  Message *in_stack_ffffffffffffffd0;
  FileOptions *this_00;
  
  this_00 = in_RDI;
  memset(&stack0xffffffffffffffd4,0,4);
  metadata = GetArenaNoVirtual(in_stack_ffffffffffffff80);
LAB_0051e52a:
  do {
    bVar1 = internal::ParseContext::Done
                      ((ParseContext *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0051f02e;
    in_RSI = (FileOptions *)
             internal::ReadTag((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                               ,(uint32 *)in_stack_ffffffffffffffa0,
                               (uint32)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    if (in_RSI == (FileOptions *)0x0) goto LAB_0051f04e;
    in_stack_ffffffffffffffac = in_stack_ffffffffffffffc4 >> 3;
    if (in_stack_ffffffffffffffac == 1) {
      if ((in_stack_ffffffffffffffc4 & 0xff) != 10) goto LAB_0051ef5a;
      _internal_mutable_java_package_abi_cxx11_(in_stack_ffffffffffffff90);
      in_RSI = (FileOptions *)
               internal::InlineGreedyStringParserUTF8Verify
                         (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                          (ParseContext *)in_stack_ffffffffffffff90,
                          (char *)in_stack_ffffffffffffff88);
    }
    else {
      if (in_stack_ffffffffffffffac == 8) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x42) {
          _internal_mutable_java_outer_classname_abi_cxx11_(in_stack_ffffffffffffff90);
          in_RSI = (FileOptions *)
                   internal::InlineGreedyStringParserUTF8Verify
                             (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                              (ParseContext *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 9) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x48) {
          psVar2 = (string *)internal::ReadVarint((char **)in_stack_ffffffffffffff80);
          if (in_RSI == (FileOptions *)0x0) goto LAB_0051f04e;
          bVar1 = FileOptions_OptimizeMode_IsValid((FileOptions_OptimizeMode)psVar2);
          if (bVar1) {
            _internal_set_optimize_for(in_RDI,(FileOptions_OptimizeMode)psVar2);
          }
          else {
            mutable_unknown_fields(in_stack_ffffffffffffff80);
            internal::WriteVarint
                      ((uint32)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                       (uint64)in_stack_ffffffffffffff78,(UnknownFieldSet *)0x51e804);
            in_stack_ffffffffffffffa0 = psVar2;
          }
          goto LAB_0051e52a;
        }
      }
      else if (in_stack_ffffffffffffffac == 10) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x50) {
          _Internal::set_has_java_multiple_files((HasBits *)&stack0xffffffffffffffd4);
          uVar3 = internal::ReadVarint((char **)in_stack_ffffffffffffff80);
          in_RDI->java_multiple_files_ = uVar3 != 0;
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0xb) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x5a) {
          _internal_mutable_go_package_abi_cxx11_(in_stack_ffffffffffffff90);
          in_RSI = (FileOptions *)
                   internal::InlineGreedyStringParserUTF8Verify
                             (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                              (ParseContext *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0x10) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x80) {
          _Internal::set_has_cc_generic_services((HasBits *)&stack0xffffffffffffffd4);
          uVar3 = internal::ReadVarint((char **)in_stack_ffffffffffffff80);
          in_RDI->cc_generic_services_ = uVar3 != 0;
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0x11) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x88) {
          _Internal::set_has_java_generic_services((HasBits *)&stack0xffffffffffffffd4);
          uVar3 = internal::ReadVarint((char **)in_stack_ffffffffffffff80);
          in_RDI->java_generic_services_ = uVar3 != 0;
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0x12) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x90) {
          _Internal::set_has_py_generic_services((HasBits *)&stack0xffffffffffffffd4);
          uVar3 = internal::ReadVarint((char **)in_stack_ffffffffffffff80);
          in_RDI->py_generic_services_ = uVar3 != 0;
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0x14) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0xa0) {
          _Internal::set_has_java_generate_equals_and_hash((HasBits *)&stack0xffffffffffffffd4);
          uVar3 = internal::ReadVarint((char **)in_stack_ffffffffffffff80);
          in_RDI->java_generate_equals_and_hash_ = uVar3 != 0;
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0x17) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0xb8) {
          _Internal::set_has_deprecated((HasBits *)&stack0xffffffffffffffd4);
          uVar3 = internal::ReadVarint((char **)in_stack_ffffffffffffff80);
          in_RDI->deprecated_ = uVar3 != 0;
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0x1b) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0xd8) {
          _Internal::set_has_java_string_check_utf8((HasBits *)&stack0xffffffffffffffd4);
          uVar3 = internal::ReadVarint((char **)in_stack_ffffffffffffff80);
          in_RDI->java_string_check_utf8_ = uVar3 != 0;
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0x1f) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0xf8) {
          _Internal::set_has_cc_enable_arenas((HasBits *)&stack0xffffffffffffffd4);
          uVar3 = internal::ReadVarint((char **)in_stack_ffffffffffffff80);
          in_RDI->cc_enable_arenas_ = uVar3 != 0;
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0x24) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x22) {
          _internal_mutable_objc_class_prefix_abi_cxx11_(in_stack_ffffffffffffff90);
          in_RSI = (FileOptions *)
                   internal::InlineGreedyStringParserUTF8Verify
                             (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                              (ParseContext *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0x25) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x2a) {
          _internal_mutable_csharp_namespace_abi_cxx11_(in_stack_ffffffffffffff90);
          in_RSI = (FileOptions *)
                   internal::InlineGreedyStringParserUTF8Verify
                             (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                              (ParseContext *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0x27) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x3a) {
          _internal_mutable_swift_prefix_abi_cxx11_(in_stack_ffffffffffffff90);
          in_RSI = (FileOptions *)
                   internal::InlineGreedyStringParserUTF8Verify
                             (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                              (ParseContext *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0x28) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x42) {
          _internal_mutable_php_class_prefix_abi_cxx11_(in_stack_ffffffffffffff90);
          in_RSI = (FileOptions *)
                   internal::InlineGreedyStringParserUTF8Verify
                             (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                              (ParseContext *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0x29) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x4a) {
          _internal_mutable_php_namespace_abi_cxx11_(in_stack_ffffffffffffff90);
          in_RSI = (FileOptions *)
                   internal::InlineGreedyStringParserUTF8Verify
                             (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                              (ParseContext *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0x2a) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x50) {
          _Internal::set_has_php_generic_services((HasBits *)&stack0xffffffffffffffd4);
          uVar3 = internal::ReadVarint((char **)in_stack_ffffffffffffff80);
          in_RDI->php_generic_services_ = uVar3 != 0;
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0x2c) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x62) {
          _internal_mutable_php_metadata_namespace_abi_cxx11_(in_stack_ffffffffffffff90);
          in_RSI = (FileOptions *)
                   internal::InlineGreedyStringParserUTF8Verify
                             (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                              (ParseContext *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
          goto joined_r0x0051eddc;
        }
      }
      else if (in_stack_ffffffffffffffac == 0x2d) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x6a) {
          _internal_mutable_ruby_package_abi_cxx11_(in_stack_ffffffffffffff90);
          in_RSI = (FileOptions *)
                   internal::InlineGreedyStringParserUTF8Verify
                             (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                              (ParseContext *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
          goto joined_r0x0051eddc;
        }
      }
      else if ((in_stack_ffffffffffffffac == 999) && ((in_stack_ffffffffffffffc4 & 0xff) == 0x3a)) {
        do {
          in_stack_ffffffffffffff98 = in_RDX;
          in_RDX = in_stack_ffffffffffffff98;
          _internal_add_uninterpreted_option((FileOptions *)0x51eefd);
          in_RSI = (FileOptions *)
                   internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                             (in_stack_ffffffffffffff98,
                              (UninterpretedOption *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
          if (in_RSI == (FileOptions *)0x0) goto LAB_0051f04e;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            (&in_RDX->super_EpsCopyInputStream,(char *)in_RSI);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<7994u>((char *)in_RSI), bVar1));
        goto LAB_0051e52a;
      }
LAB_0051ef5a:
      if (((in_stack_ffffffffffffffc4 & 7) == 4) || (in_stack_ffffffffffffffc4 == 0)) {
        internal::EpsCopyInputStream::SetLastTag
                  (&in_RDX->super_EpsCopyInputStream,in_stack_ffffffffffffffc4);
        goto LAB_0051f02e;
      }
      if (in_stack_ffffffffffffffc4 < 8000) {
        in_RSI = (FileOptions *)
                 internal::UnknownFieldParse
                           ((uint32)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                            (InternalMetadataWithArena *)in_stack_ffffffffffffff98,
                            (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      else {
        in_stack_ffffffffffffff80 = (FileOptions *)&in_RDI->_extensions_;
        in_stack_ffffffffffffff88 = (ParseContext *)(ulong)in_stack_ffffffffffffffc4;
        pFVar4 = in_RSI;
        internal_default_instance();
        pFVar4 = (FileOptions *)
                 internal::ExtensionSet::ParseField
                           ((ExtensionSet *)this_00,(uint64)pFVar4,(char *)in_RDX,
                            in_stack_ffffffffffffffd0,(InternalMetadataWithArena *)metadata,
                            (ParseContext *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        in_stack_ffffffffffffff90 = in_RSI;
        in_RSI = pFVar4;
      }
    }
joined_r0x0051eddc:
    if (in_RSI == (FileOptions *)0x0) {
LAB_0051f04e:
      in_RSI = (FileOptions *)0x0;
LAB_0051f02e:
      internal::HasBits<1UL>::Or(&in_RDI->_has_bits_,(HasBits<1UL> *)&stack0xffffffffffffffd4);
      return (char *)in_RSI;
    }
  } while( true );
}

Assistant:

const char* FileOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string java_package = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_java_package(), ptr, ctx, "google.protobuf.FileOptions.java_package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string java_outer_classname = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_java_outer_classname(), ptr, ctx, "google.protobuf.FileOptions.java_outer_classname");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 72)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FileOptions_OptimizeMode_IsValid(val))) {
            _internal_set_optimize_for(static_cast<PROTOBUF_NAMESPACE_ID::FileOptions_OptimizeMode>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(9, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional bool java_multiple_files = 10 [default = false];
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          _Internal::set_has_java_multiple_files(&has_bits);
          java_multiple_files_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string go_package = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 90)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_go_package(), ptr, ctx, "google.protobuf.FileOptions.go_package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool cc_generic_services = 16 [default = false];
      case 16:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 128)) {
          _Internal::set_has_cc_generic_services(&has_bits);
          cc_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool java_generic_services = 17 [default = false];
      case 17:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 136)) {
          _Internal::set_has_java_generic_services(&has_bits);
          java_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool py_generic_services = 18 [default = false];
      case 18:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 144)) {
          _Internal::set_has_py_generic_services(&has_bits);
          py_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 160)) {
          _Internal::set_has_java_generate_equals_and_hash(&has_bits);
          java_generate_equals_and_hash_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 23 [default = false];
      case 23:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 184)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool java_string_check_utf8 = 27 [default = false];
      case 27:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 216)) {
          _Internal::set_has_java_string_check_utf8(&has_bits);
          java_string_check_utf8_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool cc_enable_arenas = 31 [default = false];
      case 31:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 248)) {
          _Internal::set_has_cc_enable_arenas(&has_bits);
          cc_enable_arenas_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string objc_class_prefix = 36;
      case 36:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_objc_class_prefix(), ptr, ctx, "google.protobuf.FileOptions.objc_class_prefix");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string csharp_namespace = 37;
      case 37:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_csharp_namespace(), ptr, ctx, "google.protobuf.FileOptions.csharp_namespace");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string swift_prefix = 39;
      case 39:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_swift_prefix(), ptr, ctx, "google.protobuf.FileOptions.swift_prefix");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string php_class_prefix = 40;
      case 40:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_php_class_prefix(), ptr, ctx, "google.protobuf.FileOptions.php_class_prefix");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string php_namespace = 41;
      case 41:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_php_namespace(), ptr, ctx, "google.protobuf.FileOptions.php_namespace");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool php_generic_services = 42 [default = false];
      case 42:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          _Internal::set_has_php_generic_services(&has_bits);
          php_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string php_metadata_namespace = 44;
      case 44:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 98)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_php_metadata_namespace(), ptr, ctx, "google.protobuf.FileOptions.php_metadata_namespace");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string ruby_package = 45;
      case 45:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 106)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_ruby_package(), ptr, ctx, "google.protobuf.FileOptions.ruby_package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}